

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PointInstancer *instancer,uint32_t indent,
          bool closing_brace)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  value_type *rel;
  value_type *pvVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined7 in_register_00000081;
  uint32_t in_R9D;
  uint32_t indent_00;
  uint indent_01;
  anon_struct_8_0_00000001_for___align this_00;
  stringstream ss;
  ListEditQual local_218;
  allocator local_211;
  string local_210;
  uint32_t local_1ec;
  undefined1 local_1e8 [64];
  ostream local_1a8 [376];
  
  indent_00 = (uint32_t)CONCAT71(in_register_00000081,closing_brace);
  this_00 = (anon_struct_8_0_00000001_for___align)((ulong)instancer & 0xffffffff);
  local_1ec = indent;
  local_1e8._40_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 0x30));
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)this_00,n);
  poVar4 = ::std::operator<<(local_1a8,(string *)&local_210);
  to_string_abi_cxx11_((string *)local_1e8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = ::std::operator<<(poVar4,(string *)local_1e8);
  poVar4 = ::std::operator<<(poVar4," PointInstancer \"");
  poVar4 = ::std::operator<<(poVar4,(string *)(this + 0xa78));
  ::std::operator<<(poVar4,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  iVar1 = (int)instancer;
  n_02 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)instancer & 0xffffffff),n_00);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar4,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1a10,(PrimMeta *)(ulong)(iVar1 + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)instancer & 0xffffffff),n_01);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar4,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)instancer & 0xffffffff),n_02);
  poVar4 = ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::operator<<(poVar4,"{\n");
  ::std::__cxx11::string::_M_dispose();
  local_1e8._32_8_ = this_00;
  if (this[0x1e68] != (tinyusdz)0x0) {
    rel = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                    ((optional<tinyusdz::Relationship> *)(this + 0x1e68));
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0x1e68));
    local_218 = pvVar5->listOpQual;
    ::std::__cxx11::string::string((string *)local_1e8,"prototypes",&local_211);
    indent_00 = iVar1 + 1;
    anon_unknown_173::print_relationship
              (&local_210,rel,&local_218,SUB81((string *)local_1e8,0),(string *)(ulong)indent_00,
               in_R9D);
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  indent_01 = iVar1 + 1;
  ::std::__cxx11::string::string((string *)local_1e8,"protoIndices",(allocator *)&local_218);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_210,this + 0x2178,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"ids",(allocator *)&local_218);
  print_typed_attr<std::vector<long,std::allocator<long>>>
            (&local_210,this + 0x23f0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"invisibleIds",(allocator *)&local_218);
  print_typed_attr<std::vector<long,std::allocator<long>>>
            (&local_210,this + 0x3538,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"positions",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_210,this + 0x2668,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"orientations",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
            (&local_210,this + 0x28e0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"scales",(allocator *)&local_218);
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            (&local_210,this + 0x2b58,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"velocities",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x2dd0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"accelerations",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x3048,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"angularVelocities",(allocator *)&local_218);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x32c0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::PointInstancer>(&local_210,(PointInstancer *)this,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_1ec != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1e8._32_8_,n_03);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar4,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  uVar2 = local_1e8._40_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 0x30));
  return (string *)uVar2;
}

Assistant:

std::string to_string(const PointInstancer &instancer, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(instancer.spec)
     << " PointInstancer \"" << instancer.name << "\"\n";
  if (instancer.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(instancer.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (instancer.prototypes) {
    ss << print_relationship(instancer.prototypes.value(),
                             instancer.prototypes.value().get_listedit_qual(),
                             /* custom */ false, "prototypes", indent + 1);
  }
  ss << print_typed_attr(instancer.protoIndices, "protoIndices", indent + 1);
  ss << print_typed_attr(instancer.ids, "ids", indent + 1);
  ss << print_typed_attr(instancer.invisibleIds, "invisibleIds", indent + 1);
  ss << print_typed_attr(instancer.positions, "positions", indent + 1);
  ss << print_typed_attr(instancer.orientations, "orientations", indent + 1);
  ss << print_typed_attr(instancer.scales, "scales", indent + 1);
  ss << print_typed_attr(instancer.velocities, "velocities", indent + 1);
  ss << print_typed_attr(instancer.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(instancer.angularVelocities, "angularVelocities",
                         indent + 1);

  ss << print_gprim_predefined(instancer, indent + 1);

  ss << print_props(instancer.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}